

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O3

void TestImpl(char *name,Span<const_unsigned_char> der,char *password,char *friendly_name)

{
  int iVar1;
  X509 *x;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar2;
  pointer pcVar3;
  char *in_R9;
  pointer *__ptr;
  ScopedTrace gtest_trace_41;
  UniquePtr<EVP_PKEY> delete_key;
  int actual_name_len;
  UniquePtr<struct_stack_st_X509> certs;
  CBS pkcs12;
  EVP_PKEY *key;
  AssertHelper local_90;
  ScopedTrace local_81;
  undefined1 local_80 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_50;
  AssertHelper local_48;
  _Head_base<0UL,_stack_st_X509_*,_false> local_40;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_28;
  char *local_20;
  
  local_20 = friendly_name;
  testing::ScopedTrace::ScopedTrace
            (&local_81,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
             ,0x29,name);
  local_40._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
  local_38[0] = (OPENSSL_STACK *)local_40._M_head_impl != (OPENSSL_STACK *)0x0;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((OPENSSL_STACK *)local_40._M_head_impl == (OPENSSL_STACK *)0x0) {
    testing::Message::Message((Message *)local_80);
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_30;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)local_38,(AssertionResult *)0x5add24,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x2b,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
    }
    __ptr_00._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30;
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_80 !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_80 + 8))();
      __ptr_00._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30;
    }
  }
  else {
    local_28._M_head_impl = (evp_pkey_st *)0x0;
    local_38 = (undefined1  [8])der.data_;
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)der.size_;
    iVar1 = PKCS12_get_key_and_certs
                      (&local_28._M_head_impl,local_40._M_head_impl,(CBS *)local_38,password);
    local_80[0] = iVar1 != 0;
    local_78._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      local_50._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)local_28._M_head_impl;
      local_90.data_._0_4_ = 1;
      local_80 = (undefined1  [8])OPENSSL_sk_num((OPENSSL_STACK *)local_40._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_70,"1u","sk_X509_num(certs.get())",(uint *)&local_90,
                 (unsigned_long *)local_80);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_80);
        if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_68->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x32,pcVar3);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)local_80);
        goto LAB_0034315a;
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      local_80[0] = local_28._M_head_impl != (evp_pkey_st *)0x0;
      local_78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_28._M_head_impl == (evp_pkey_st *)0x0) {
        testing::Message::Message((Message *)&local_90);
        pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_70,(internal *)local_80,(AssertionResult *)0x5e57b2,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x33,(char *)CONCAT71(local_70._1_7_,local_70[0]));
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1
                         );
        }
        if (local_90.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_78._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_00343183;
      }
      else {
        x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_40._M_head_impl,0);
        local_80 = (undefined1  [8])X509_alias_get0(x,(int *)&local_48);
        if (local_20 == (char *)0x0) {
          local_90.data_ = (AssertHelperData *)0x0;
          testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char_const*>
                    ((internal *)local_70,"nullptr","actual_name",(uchar **)&local_90,
                     (uchar **)local_80);
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_80);
            if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar3 = "";
            }
            else {
              pcVar3 = (local_68->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x39,pcVar3);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)local_80);
            goto LAB_0034315a;
          }
        }
        else {
          local_78._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
          local_80 = (undefined1  [8])(long)(int)local_48.data_;
          testing::internal::
          CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                    ((internal *)local_70,"friendly_name",
                     "bssl::BytesAsStringView( bssl::Span(actual_name, actual_name_len))",&local_20,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_80);
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_80);
            if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar3 = "";
            }
            else {
              pcVar3 = (local_68->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x3c,pcVar3);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)local_80);
LAB_0034315a:
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            if (local_80 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_80 + 8))();
            }
          }
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68;
LAB_00343183:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar2,local_68);
        }
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
      goto LAB_00343192;
    }
    testing::Message::Message((Message *)&local_90);
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_78;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)local_80,
               (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, password)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x2f,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
    }
    __ptr_00._M_head_impl = local_78._M_head_impl;
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
      __ptr_00._M_head_impl = local_78._M_head_impl;
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr_00._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(pdVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __ptr_00._M_head_impl);
  }
LAB_00343192:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&local_40);
  testing::ScopedTrace::~ScopedTrace(&local_81);
  return;
}

Assistant:

static void TestImpl(const char *name, bssl::Span<const uint8_t> der,
                     const char *password,
                     const char *friendly_name) {
  SCOPED_TRACE(name);
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);

  EVP_PKEY *key = nullptr;
  CBS pkcs12 = der;
  ASSERT_TRUE(PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, password));
  bssl::UniquePtr<EVP_PKEY> delete_key(key);

  ASSERT_EQ(1u, sk_X509_num(certs.get()));
  ASSERT_TRUE(key);

  int actual_name_len;
  const uint8_t *actual_name =
      X509_alias_get0(sk_X509_value(certs.get(), 0), &actual_name_len);
  if (friendly_name == nullptr) {
    EXPECT_EQ(nullptr, actual_name);
  } else {
    EXPECT_EQ(friendly_name, bssl::BytesAsStringView(
                                 bssl::Span(actual_name, actual_name_len)));
  }
}